

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O1

void lj_func_closeuv(lua_State *L,TValue *level)

{
  byte bVar1;
  uint uVar2;
  GCobj *o;
  GCupval *uv;
  global_State *g;
  
  uVar2 = (L->openupval).gcptr32;
  if (uVar2 != 0) {
    g = (global_State *)(ulong)(L->glref).ptr32;
    do {
      uv = (GCupval *)(ulong)uVar2;
      if ((TValue *)(ulong)(uv->v).ptr32 < level) {
        return;
      }
      (L->openupval).gcptr32 = (uv->nextgc).gcptr32;
      if ((~(g->gc).currentwhite & uv->marked & 3) == 0) {
        *(uint32_t *)((ulong)(uv->field_5).field_1.next.gcptr32 + 8) =
             (uv->field_5).field_1.prev.gcptr32;
        *(uint32_t *)((ulong)(uv->field_5).field_1.prev.gcptr32 + 0xc) =
             (uv->field_5).field_1.next.gcptr32;
        uv->field_5 = *(anon_union_8_2_fd64ecd7_for_GCupval_5 *)(ulong)(uv->v).ptr32;
        (uv->v).ptr32 = (uint32_t)&uv->field_5;
        uv->closed = '\x01';
        (uv->nextgc).gcptr32 = (g->gc).root.gcptr32;
        (g->gc).root.gcptr32 = uVar2;
        bVar1 = uv->marked;
        if ((bVar1 & 7) == 0) {
          if ((byte)((g->gc).state - 1) < 2) {
            uv->marked = bVar1 | 4;
            if (((uv->field_5).field_1.next.gcptr32 + 0xd < 9) &&
               (o = (GCobj *)(ulong)(uv->field_5).field_1.prev.gcptr32, ((o->gch).marked & 3) != 0))
            {
              if (1 < (byte)((g->gc).state - 1)) goto LAB_0010c0d9;
              gc_mark(g,o);
            }
          }
          else {
LAB_0010c0d9:
            uv->marked = (g->gc).currentwhite & 3 | bVar1;
          }
        }
      }
      else {
        lj_func_freeuv(g,uv);
      }
      uVar2 = (L->openupval).gcptr32;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_func_closeuv(lua_State *L, TValue *level)
{
  GCupval *uv;
  global_State *g = G(L);
  while (gcref(L->openupval) != NULL &&
	 uvval((uv = gco2uv(gcref(L->openupval)))) >= level) {
    GCobj *o = obj2gco(uv);
    lua_assert(!isblack(o) && !uv->closed && uvval(uv) != &uv->tv);
    setgcrefr(L->openupval, uv->nextgc);  /* No longer in open list. */
    if (isdead(g, o)) {
      lj_func_freeuv(g, uv);
    } else {
      unlinkuv(uv);
      lj_gc_closeuv(g, uv);
    }
  }
}